

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::BVHNIntersector1<8,_1,_true,_embree::avx2::SubGridIntersector1Pluecker<8,_true>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  RTCIntersectArguments *pRVar14;
  RTCRayQueryContext *pRVar15;
  undefined1 auVar16 [32];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  int iVar67;
  long lVar68;
  long lVar69;
  undefined4 uVar70;
  undefined1 (*pauVar71) [16];
  uint uVar72;
  long lVar73;
  ulong uVar74;
  undefined1 (*pauVar75) [16];
  uint uVar76;
  ulong uVar77;
  undefined1 (*pauVar78) [16];
  ulong uVar79;
  long lVar80;
  ulong uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar95;
  float fVar96;
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar97;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar98;
  undefined1 auVar101 [16];
  float fVar99;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar102 [32];
  undefined1 auVar100 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined8 uVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar140 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar157;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar158 [32];
  float fVar162;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2a30) [16];
  ulong local_2a28;
  undefined1 local_2a19;
  uint local_2a18;
  int local_2a14;
  ulong local_2a10;
  ulong local_2a08;
  ulong local_2a00;
  ulong local_29f8;
  ulong local_29f0;
  ulong local_29e8;
  ulong local_29e0;
  ulong local_29d8;
  long local_29d0;
  ulong local_29c8;
  ulong local_29c0;
  ulong local_29b8;
  ulong local_29b0;
  ulong local_29a8;
  ulong local_29a0;
  long local_2998;
  long local_2990;
  long local_2988;
  Scene *local_2980;
  ulong local_2978;
  RTCFilterFunctionNArguments local_2970;
  undefined1 local_2940 [32];
  undefined1 local_2920 [48];
  float local_28f0;
  float local_28ec;
  float local_28e8;
  undefined4 local_28e4;
  undefined4 local_28e0;
  undefined4 local_28dc;
  undefined4 local_28d8;
  uint local_28d4;
  uint local_28d0;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  float local_2860;
  float fStack_285c;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  float fStack_2844;
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  float fStack_2824;
  undefined1 local_2820 [32];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 *local_2780;
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  float local_26c0 [4];
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  float local_26a0 [4];
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  undefined4 uStack_2684;
  undefined1 local_2680 [8];
  float fStack_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 local_2660;
  undefined4 uStack_265c;
  undefined4 uStack_2658;
  undefined4 uStack_2654;
  undefined4 uStack_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [8];
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  undefined1 local_2620 [8];
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined4 local_25c0;
  undefined4 uStack_25bc;
  undefined4 uStack_25b8;
  undefined4 uStack_25b4;
  undefined4 uStack_25b0;
  undefined4 uStack_25ac;
  undefined4 uStack_25a8;
  undefined4 uStack_25a4;
  undefined1 local_25a0 [32];
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  undefined1 local_2560 [8];
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  undefined4 uStack_24f0;
  undefined4 uStack_24ec;
  undefined4 uStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  float fVar118;
  float fVar127;
  float fVar128;
  float fVar129;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      local_2a30 = (undefined1 (*) [16])local_2390;
      auVar82 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar89 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar1 = (ray->super_RayK<1>).dir.field_0;
      auVar119._8_4_ = 0x7fffffff;
      auVar119._0_8_ = 0x7fffffff7fffffff;
      auVar119._12_4_ = 0x7fffffff;
      auVar119 = vandps_avx((undefined1  [16])aVar1,auVar119);
      auVar131._8_4_ = 0x219392ef;
      auVar131._0_8_ = 0x219392ef219392ef;
      auVar131._12_4_ = 0x219392ef;
      auVar119 = vcmpps_avx(auVar119,auVar131,1);
      auVar132._8_4_ = 0x3f800000;
      auVar132._0_8_ = &DAT_3f8000003f800000;
      auVar132._12_4_ = 0x3f800000;
      auVar131 = vdivps_avx(auVar132,(undefined1  [16])aVar1);
      auVar133._8_4_ = 0x5d5e0b6b;
      auVar133._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar133._12_4_ = 0x5d5e0b6b;
      auVar119 = vblendvps_avx(auVar131,auVar133,auVar119);
      auVar120._0_4_ = auVar119._0_4_ * 0.99999964;
      auVar120._4_4_ = auVar119._4_4_ * 0.99999964;
      auVar120._8_4_ = auVar119._8_4_ * 0.99999964;
      auVar120._12_4_ = auVar119._12_4_ * 0.99999964;
      uVar70 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_2880._4_4_ = uVar70;
      local_2880._0_4_ = uVar70;
      local_2880._8_4_ = uVar70;
      local_2880._12_4_ = uVar70;
      local_2880._16_4_ = uVar70;
      local_2880._20_4_ = uVar70;
      local_2880._24_4_ = uVar70;
      local_2880._28_4_ = uVar70;
      uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_28a0._4_4_ = uVar70;
      local_28a0._0_4_ = uVar70;
      local_28a0._8_4_ = uVar70;
      local_28a0._12_4_ = uVar70;
      local_28a0._16_4_ = uVar70;
      local_28a0._20_4_ = uVar70;
      local_28a0._24_4_ = uVar70;
      local_28a0._28_4_ = uVar70;
      local_25c0 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      uStack_25bc = local_25c0;
      uStack_25b8 = local_25c0;
      uStack_25b4 = local_25c0;
      uStack_25b0 = local_25c0;
      uStack_25ac = local_25c0;
      uStack_25a8 = local_25c0;
      uStack_25a4 = local_25c0;
      auVar111._0_4_ = auVar119._0_4_ * 1.0000004;
      auVar111._4_4_ = auVar119._4_4_ * 1.0000004;
      auVar111._8_4_ = auVar119._8_4_ * 1.0000004;
      auVar111._12_4_ = auVar119._12_4_ * 1.0000004;
      auVar119 = vmovshdup_avx(auVar120);
      uVar130 = auVar119._0_8_;
      register0x00001488 = uVar130;
      local_2680 = uVar130;
      register0x00001490 = uVar130;
      register0x00001498 = uVar130;
      auVar132 = vshufpd_avx(auVar120,auVar120,1);
      auVar131 = vshufps_avx(auVar120,auVar120,0xaa);
      local_25e0 = auVar131._0_8_;
      uStack_25d8 = local_25e0;
      uStack_25d0 = local_25e0;
      uStack_25c8 = local_25e0;
      local_2600 = auVar111._0_4_;
      fStack_25fc = auVar111._0_4_;
      fStack_25f8 = auVar111._0_4_;
      fStack_25f4 = auVar111._0_4_;
      fStack_25f0 = auVar111._0_4_;
      fStack_25ec = auVar111._0_4_;
      fStack_25e8 = auVar111._0_4_;
      fStack_25e4 = auVar111._0_4_;
      auVar131 = vmovshdup_avx(auVar111);
      local_2620 = auVar131._0_8_;
      register0x00001308 = local_2620;
      register0x00001310 = local_2620;
      register0x00001318 = local_2620;
      auVar131 = vshufps_avx(auVar111,auVar111,0xaa);
      local_2640 = auVar131._0_8_;
      register0x000012c8 = local_2640;
      register0x000012d0 = local_2640;
      register0x000012d8 = local_2640;
      local_29a0 = (ulong)(auVar120._0_4_ < 0.0) << 5;
      auVar139 = ZEXT3264(local_2880);
      auVar156 = ZEXT3264(_local_2680);
      local_29a8 = (ulong)(auVar119._0_4_ < 0.0) << 5 | 0x40;
      auVar149 = ZEXT3264(local_28a0);
      local_29b0 = (ulong)(auVar132._0_4_ < 0.0) << 5 | 0x80;
      local_29b8 = local_29a0 ^ 0x20;
      local_2660 = auVar82._0_4_;
      uStack_265c = local_2660;
      uStack_2658 = local_2660;
      uStack_2654 = local_2660;
      uStack_2650 = local_2660;
      uStack_264c = local_2660;
      uStack_2648 = local_2660;
      uStack_2644 = local_2660;
      local_2840 = auVar89._0_4_;
      fStack_283c = local_2840;
      fStack_2838 = local_2840;
      fStack_2834 = local_2840;
      fStack_2830 = local_2840;
      fStack_282c = local_2840;
      fStack_2828 = local_2840;
      fStack_2824 = local_2840;
      local_29d8 = (ulong)(((uint)(auVar120._0_4_ < 0.0) << 5) >> 2);
      local_29e0 = local_29b8 >> 2;
      local_29e8 = local_29a8 >> 2;
      local_29c0 = local_29a8 ^ 0x20;
      local_29f0 = (local_29a8 ^ 0x20) >> 2;
      local_29f8 = local_29b0 >> 2;
      local_25a0._16_16_ = mm_lookupmask_ps._240_16_;
      local_25a0._0_16_ = mm_lookupmask_ps._240_16_;
      local_2540 = vperm2f128_avx(local_25a0,mm_lookupmask_ps._0_32_,2);
      local_29c8 = local_29b0 ^ 0x20;
      local_2a00 = (local_29b0 ^ 0x20) >> 2;
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = &DAT_3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar102._16_4_ = 0x3f800000;
      auVar102._20_4_ = 0x3f800000;
      auVar102._24_4_ = 0x3f800000;
      auVar102._28_4_ = 0x3f800000;
      auVar147._8_4_ = 0xbf800000;
      auVar147._0_8_ = 0xbf800000bf800000;
      auVar147._12_4_ = 0xbf800000;
      auVar147._16_4_ = 0xbf800000;
      auVar147._20_4_ = 0xbf800000;
      auVar147._24_4_ = 0xbf800000;
      auVar147._28_4_ = 0xbf800000;
      _local_2560 = vblendvps_avx(auVar102,auVar147,local_2540);
      local_2580 = auVar120._0_4_;
      fStack_257c = auVar120._0_4_;
      fStack_2578 = auVar120._0_4_;
      fStack_2574 = auVar120._0_4_;
      fStack_2570 = auVar120._0_4_;
      fStack_256c = auVar120._0_4_;
      fStack_2568 = auVar120._0_4_;
      fStack_2564 = auVar120._0_4_;
      fVar161 = auVar120._0_4_;
      fVar88 = auVar120._0_4_;
      fVar98 = auVar120._0_4_;
      fVar99 = auVar120._0_4_;
      fVar107 = auVar120._0_4_;
      fVar108 = auVar120._0_4_;
      do {
        do {
          do {
            if (local_2a30 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar71 = local_2a30 + -1;
            local_2a30 = local_2a30 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar71 + 8));
          local_2a28 = *(ulong *)*local_2a30;
          do {
            if ((local_2a28 & 8) == 0) {
              auVar147 = vsubps_avx(*(undefined1 (*) [32])(local_2a28 + 0x40 + local_29a0),
                                    auVar139._0_32_);
              auVar16._4_4_ = fVar161 * auVar147._4_4_;
              auVar16._0_4_ = auVar120._0_4_ * auVar147._0_4_;
              auVar16._8_4_ = fVar88 * auVar147._8_4_;
              auVar16._12_4_ = fVar98 * auVar147._12_4_;
              auVar16._16_4_ = fVar99 * auVar147._16_4_;
              auVar16._20_4_ = fVar107 * auVar147._20_4_;
              auVar16._24_4_ = fVar108 * auVar147._24_4_;
              auVar16._28_4_ = auVar147._28_4_;
              auVar147 = vsubps_avx(*(undefined1 (*) [32])(local_2a28 + 0x40 + local_29a8),
                                    auVar149._0_32_);
              auVar24._4_4_ = auVar156._4_4_ * auVar147._4_4_;
              auVar24._0_4_ = auVar156._0_4_ * auVar147._0_4_;
              auVar24._8_4_ = auVar156._8_4_ * auVar147._8_4_;
              auVar24._12_4_ = auVar156._12_4_ * auVar147._12_4_;
              auVar24._16_4_ = auVar156._16_4_ * auVar147._16_4_;
              auVar24._20_4_ = auVar156._20_4_ * auVar147._20_4_;
              auVar24._24_4_ = auVar156._24_4_ * auVar147._24_4_;
              auVar24._28_4_ = auVar147._28_4_;
              auVar147 = vmaxps_avx(auVar16,auVar24);
              auVar65._4_4_ = uStack_25bc;
              auVar65._0_4_ = local_25c0;
              auVar65._8_4_ = uStack_25b8;
              auVar65._12_4_ = uStack_25b4;
              auVar65._16_4_ = uStack_25b0;
              auVar65._20_4_ = uStack_25ac;
              auVar65._24_4_ = uStack_25a8;
              auVar65._28_4_ = uStack_25a4;
              auVar102 = vsubps_avx(*(undefined1 (*) [32])(local_2a28 + 0x40 + local_29b0),auVar65);
              auVar148._4_4_ = auVar102._4_4_ * local_25e0._4_4_;
              auVar148._0_4_ = auVar102._0_4_ * (float)local_25e0;
              auVar148._8_4_ = auVar102._8_4_ * (float)uStack_25d8;
              auVar148._12_4_ = auVar102._12_4_ * uStack_25d8._4_4_;
              auVar148._16_4_ = auVar102._16_4_ * (float)uStack_25d0;
              auVar148._20_4_ = auVar102._20_4_ * uStack_25d0._4_4_;
              auVar148._24_4_ = auVar102._24_4_ * (float)uStack_25c8;
              auVar148._28_4_ = auVar102._28_4_;
              auVar102 = vsubps_avx(*(undefined1 (*) [32])(local_2a28 + 0x40 + local_29b8),
                                    auVar139._0_32_);
              auVar125._4_4_ = auVar102._4_4_ * fStack_25fc;
              auVar125._0_4_ = auVar102._0_4_ * local_2600;
              auVar125._8_4_ = auVar102._8_4_ * fStack_25f8;
              auVar125._12_4_ = auVar102._12_4_ * fStack_25f4;
              auVar125._16_4_ = auVar102._16_4_ * fStack_25f0;
              auVar125._20_4_ = auVar102._20_4_ * fStack_25ec;
              auVar125._24_4_ = auVar102._24_4_ * fStack_25e8;
              auVar125._28_4_ = auVar102._28_4_;
              auVar102 = vsubps_avx(*(undefined1 (*) [32])(local_2a28 + 0x40 + local_29c0),
                                    auVar149._0_32_);
              auVar25._4_4_ = auVar102._4_4_ * (float)local_2620._4_4_;
              auVar25._0_4_ = auVar102._0_4_ * (float)local_2620._0_4_;
              auVar25._8_4_ = auVar102._8_4_ * fStack_2618;
              auVar25._12_4_ = auVar102._12_4_ * fStack_2614;
              auVar25._16_4_ = auVar102._16_4_ * fStack_2610;
              auVar25._20_4_ = auVar102._20_4_ * fStack_260c;
              auVar25._24_4_ = auVar102._24_4_ * fStack_2608;
              auVar25._28_4_ = auVar102._28_4_;
              auVar16 = vminps_avx(auVar125,auVar25);
              auVar102 = vsubps_avx(*(undefined1 (*) [32])(local_2a28 + 0x40 + local_29c8),auVar65);
              auVar155._4_4_ = auVar102._4_4_ * (float)local_2640._4_4_;
              auVar155._0_4_ = auVar102._0_4_ * (float)local_2640._0_4_;
              auVar155._8_4_ = auVar102._8_4_ * fStack_2638;
              auVar155._12_4_ = auVar102._12_4_ * fStack_2634;
              auVar155._16_4_ = auVar102._16_4_ * fStack_2630;
              auVar155._20_4_ = auVar102._20_4_ * fStack_262c;
              auVar155._24_4_ = auVar102._24_4_ * fStack_2628;
              auVar155._28_4_ = auVar102._28_4_;
              auVar63._4_4_ = uStack_265c;
              auVar63._0_4_ = local_2660;
              auVar63._8_4_ = uStack_2658;
              auVar63._12_4_ = uStack_2654;
              auVar63._16_4_ = uStack_2650;
              auVar63._20_4_ = uStack_264c;
              auVar63._24_4_ = uStack_2648;
              auVar63._28_4_ = uStack_2644;
              auVar102 = vmaxps_avx(auVar148,auVar63);
              local_27e0 = vmaxps_avx(auVar147,auVar102);
              auVar180._4_4_ = fStack_283c;
              auVar180._0_4_ = local_2840;
              auVar180._8_4_ = fStack_2838;
              auVar180._12_4_ = fStack_2834;
              auVar180._16_4_ = fStack_2830;
              auVar180._20_4_ = fStack_282c;
              auVar180._24_4_ = fStack_2828;
              auVar180._28_4_ = fStack_2824;
              auVar147 = vminps_avx(auVar155,auVar180);
              auVar147 = vminps_avx(auVar16,auVar147);
              auVar147 = vcmpps_avx(local_27e0,auVar147,2);
              uVar70 = vmovmskps_avx(auVar147);
              local_2a08 = CONCAT44((int)(local_2a28 >> 0x20),uVar70);
            }
            if ((local_2a28 & 8) == 0) {
              if (local_2a08 == 0) {
                iVar67 = 4;
              }
              else {
                uVar79 = local_2a28 & 0xfffffffffffffff0;
                lVar68 = 0;
                for (uVar77 = local_2a08; (uVar77 & 1) == 0;
                    uVar77 = uVar77 >> 1 | 0x8000000000000000) {
                  lVar68 = lVar68 + 1;
                }
                iVar67 = 0;
                uVar77 = local_2a08 - 1 & local_2a08;
                local_2a28 = *(ulong *)(uVar79 + lVar68 * 8);
                if (uVar77 != 0) {
                  uVar10 = *(uint *)(local_27e0 + lVar68 * 4);
                  lVar68 = 0;
                  for (uVar74 = uVar77; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000
                      ) {
                    lVar68 = lVar68 + 1;
                  }
                  uVar77 = uVar77 - 1 & uVar77;
                  uVar74 = *(ulong *)(uVar79 + lVar68 * 8);
                  uVar72 = *(uint *)(local_27e0 + lVar68 * 4);
                  if (uVar77 == 0) {
                    if (uVar10 < uVar72) {
                      *(ulong *)*local_2a30 = uVar74;
                      *(uint *)(*local_2a30 + 8) = uVar72;
                      local_2a30 = local_2a30 + 1;
                    }
                    else {
                      *(ulong *)*local_2a30 = local_2a28;
                      *(uint *)(*local_2a30 + 8) = uVar10;
                      local_2a30 = local_2a30 + 1;
                      local_2a28 = uVar74;
                    }
                  }
                  else {
                    auVar82._8_8_ = 0;
                    auVar82._0_8_ = local_2a28;
                    auVar119 = vpunpcklqdq_avx(auVar82,ZEXT416(uVar10));
                    auVar89._8_8_ = 0;
                    auVar89._0_8_ = uVar74;
                    auVar131 = vpunpcklqdq_avx(auVar89,ZEXT416(uVar72));
                    lVar68 = 0;
                    for (uVar74 = uVar77; (uVar74 & 1) == 0;
                        uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                      lVar68 = lVar68 + 1;
                    }
                    uVar77 = uVar77 - 1 & uVar77;
                    auVar100._8_8_ = 0;
                    auVar100._0_8_ = *(ulong *)(uVar79 + lVar68 * 8);
                    auVar82 = vpunpcklqdq_avx(auVar100,ZEXT416(*(uint *)(local_27e0 + lVar68 * 4)));
                    if (uVar77 == 0) {
                      auVar89 = vpcmpgtd_avx(auVar131,auVar119);
                      auVar132 = vpshufd_avx(auVar89,0xaa);
                      auVar89 = vblendvps_avx(auVar131,auVar119,auVar132);
                      auVar119 = vblendvps_avx(auVar119,auVar131,auVar132);
                      auVar131 = vpcmpgtd_avx(auVar82,auVar89);
                      auVar132 = vpshufd_avx(auVar131,0xaa);
                      auVar131 = vblendvps_avx(auVar82,auVar89,auVar132);
                      auVar82 = vblendvps_avx(auVar89,auVar82,auVar132);
                      auVar89 = vpcmpgtd_avx(auVar82,auVar119);
                      auVar132 = vpshufd_avx(auVar89,0xaa);
                      auVar89 = vblendvps_avx(auVar82,auVar119,auVar132);
                      auVar119 = vblendvps_avx(auVar119,auVar82,auVar132);
                      *local_2a30 = auVar119;
                      local_2a30[1] = auVar89;
                      local_2a28 = vmovlps_avx(auVar131);
                      local_2a30 = local_2a30 + 2;
                    }
                    else {
                      lVar68 = 0;
                      for (uVar74 = uVar77; (uVar74 & 1) == 0;
                          uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                        lVar68 = lVar68 + 1;
                      }
                      uVar77 = uVar77 - 1 & uVar77;
                      auVar112._8_8_ = 0;
                      auVar112._0_8_ = *(ulong *)(uVar79 + lVar68 * 8);
                      auVar89 = vpunpcklqdq_avx(auVar112,ZEXT416(*(uint *)(local_27e0 + lVar68 * 4))
                                               );
                      if (uVar77 == 0) {
                        auVar132 = vpcmpgtd_avx(auVar131,auVar119);
                        auVar111 = vpshufd_avx(auVar132,0xaa);
                        auVar132 = vblendvps_avx(auVar131,auVar119,auVar111);
                        auVar119 = vblendvps_avx(auVar119,auVar131,auVar111);
                        auVar131 = vpcmpgtd_avx(auVar89,auVar82);
                        auVar111 = vpshufd_avx(auVar131,0xaa);
                        auVar131 = vblendvps_avx(auVar89,auVar82,auVar111);
                        auVar82 = vblendvps_avx(auVar82,auVar89,auVar111);
                        auVar89 = vpcmpgtd_avx(auVar82,auVar119);
                        auVar111 = vpshufd_avx(auVar89,0xaa);
                        auVar89 = vblendvps_avx(auVar82,auVar119,auVar111);
                        auVar119 = vblendvps_avx(auVar119,auVar82,auVar111);
                        auVar82 = vpcmpgtd_avx(auVar131,auVar132);
                        auVar111 = vpshufd_avx(auVar82,0xaa);
                        auVar82 = vblendvps_avx(auVar131,auVar132,auVar111);
                        auVar131 = vblendvps_avx(auVar132,auVar131,auVar111);
                        auVar132 = vpcmpgtd_avx(auVar89,auVar131);
                        auVar111 = vpshufd_avx(auVar132,0xaa);
                        auVar132 = vblendvps_avx(auVar89,auVar131,auVar111);
                        auVar131 = vblendvps_avx(auVar131,auVar89,auVar111);
                        *local_2a30 = auVar119;
                        local_2a30[1] = auVar131;
                        local_2a30[2] = auVar132;
                        local_2a28 = vmovlps_avx(auVar82);
                        pauVar71 = local_2a30 + 3;
                      }
                      else {
                        *local_2a30 = auVar119;
                        local_2a30[1] = auVar131;
                        local_2a30[2] = auVar82;
                        local_2a30[3] = auVar89;
                        lVar68 = 0x30;
                        do {
                          lVar69 = lVar68;
                          lVar68 = 0;
                          for (uVar74 = uVar77; (uVar74 & 1) == 0;
                              uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                            lVar68 = lVar68 + 1;
                          }
                          auVar83._8_8_ = 0;
                          auVar83._0_8_ = *(ulong *)(uVar79 + lVar68 * 8);
                          auVar119 = vpunpcklqdq_avx(auVar83,ZEXT416(*(uint *)(local_27e0 +
                                                                              lVar68 * 4)));
                          *(undefined1 (*) [16])(local_2a30[1] + lVar69) = auVar119;
                          uVar77 = uVar77 - 1 & uVar77;
                          lVar68 = lVar69 + 0x10;
                        } while (uVar77 != 0);
                        pauVar71 = (undefined1 (*) [16])(local_2a30[1] + lVar69);
                        if (lVar69 + 0x10 != 0) {
                          lVar68 = 0x10;
                          pauVar75 = local_2a30;
                          do {
                            auVar119 = pauVar75[1];
                            uVar10 = *(uint *)(pauVar75[1] + 8);
                            pauVar75 = pauVar75 + 1;
                            lVar69 = lVar68;
                            do {
                              if (uVar10 <= *(uint *)(local_2a30[-1] + lVar69 + 8)) {
                                pauVar78 = (undefined1 (*) [16])(*local_2a30 + lVar69);
                                break;
                              }
                              *(undefined1 (*) [16])(*local_2a30 + lVar69) =
                                   *(undefined1 (*) [16])(local_2a30[-1] + lVar69);
                              lVar69 = lVar69 + -0x10;
                              pauVar78 = local_2a30;
                            } while (lVar69 != 0);
                            *pauVar78 = auVar119;
                            lVar68 = lVar68 + 0x10;
                          } while (pauVar71 != pauVar75);
                        }
                        local_2a28 = *(ulong *)*pauVar71;
                      }
                      auVar139 = ZEXT3264(local_2880);
                      auVar149 = ZEXT3264(local_28a0);
                      local_2a30 = pauVar71;
                    }
                  }
                }
              }
            }
            else {
              iVar67 = 6;
            }
          } while (iVar67 == 0);
        } while (iVar67 != 6);
        local_29d0 = (ulong)((uint)local_2a28 & 0xf) - 8;
        if (local_29d0 != 0) {
          local_2a28 = local_2a28 & 0xfffffffffffffff0;
          local_2998 = 0;
          do {
            lVar68 = local_2998 * 0x90;
            uVar70 = *(undefined4 *)(local_2a28 + 0x70 + lVar68);
            auVar103._4_4_ = uVar70;
            auVar103._0_4_ = uVar70;
            auVar103._8_4_ = uVar70;
            auVar103._12_4_ = uVar70;
            auVar103._16_4_ = uVar70;
            auVar103._20_4_ = uVar70;
            auVar103._24_4_ = uVar70;
            auVar103._28_4_ = uVar70;
            uVar70 = *(undefined4 *)(local_2a28 + 0x7c + lVar68);
            auVar113._4_4_ = uVar70;
            auVar113._0_4_ = uVar70;
            auVar113._8_4_ = uVar70;
            auVar113._12_4_ = uVar70;
            auVar113._16_4_ = uVar70;
            auVar113._20_4_ = uVar70;
            auVar113._24_4_ = uVar70;
            auVar113._28_4_ = uVar70;
            local_2990 = local_2a28 + lVar68;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *(ulong *)(local_29d8 + 0x40 + local_2990);
            auVar147 = vpmovzxbd_avx2(auVar2);
            auVar147 = vcvtdq2ps_avx(auVar147);
            auVar82 = vfmadd213ps_fma(auVar147,auVar113,auVar103);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(local_29e0 + 0x40 + local_2990);
            auVar147 = vpmovzxbd_avx2(auVar3);
            auVar147 = vcvtdq2ps_avx(auVar147);
            uVar70 = *(undefined4 *)(local_2a28 + 0x74 + lVar68);
            auVar121._4_4_ = uVar70;
            auVar121._0_4_ = uVar70;
            auVar121._8_4_ = uVar70;
            auVar121._12_4_ = uVar70;
            auVar121._16_4_ = uVar70;
            auVar121._20_4_ = uVar70;
            auVar121._24_4_ = uVar70;
            auVar121._28_4_ = uVar70;
            uVar70 = *(undefined4 *)(local_2a28 + 0x80 + lVar68);
            auVar134._4_4_ = uVar70;
            auVar134._0_4_ = uVar70;
            auVar134._8_4_ = uVar70;
            auVar134._12_4_ = uVar70;
            auVar134._16_4_ = uVar70;
            auVar134._20_4_ = uVar70;
            auVar134._24_4_ = uVar70;
            auVar134._28_4_ = uVar70;
            auVar89 = vfmadd213ps_fma(auVar147,auVar113,auVar103);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(local_29e8 + 0x40 + local_2990);
            auVar147 = vpmovzxbd_avx2(auVar4);
            auVar147 = vcvtdq2ps_avx(auVar147);
            auVar132 = vfmadd213ps_fma(auVar147,auVar134,auVar121);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(local_29f0 + 0x40 + local_2990);
            auVar147 = vpmovzxbd_avx2(auVar5);
            auVar147 = vcvtdq2ps_avx(auVar147);
            uVar70 = *(undefined4 *)(local_2a28 + 0x78 + lVar68);
            auVar142._4_4_ = uVar70;
            auVar142._0_4_ = uVar70;
            auVar142._8_4_ = uVar70;
            auVar142._12_4_ = uVar70;
            auVar142._16_4_ = uVar70;
            auVar142._20_4_ = uVar70;
            auVar142._24_4_ = uVar70;
            auVar142._28_4_ = uVar70;
            uVar70 = *(undefined4 *)(local_2a28 + 0x84 + lVar68);
            auVar151._4_4_ = uVar70;
            auVar151._0_4_ = uVar70;
            auVar151._8_4_ = uVar70;
            auVar151._12_4_ = uVar70;
            auVar151._16_4_ = uVar70;
            auVar151._20_4_ = uVar70;
            auVar151._24_4_ = uVar70;
            auVar151._28_4_ = uVar70;
            auVar111 = vfmadd213ps_fma(auVar147,auVar134,auVar121);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(local_29f8 + 0x40 + local_2990);
            auVar147 = vpmovzxbd_avx2(auVar6);
            auVar147 = vcvtdq2ps_avx(auVar147);
            auVar133 = vfmadd213ps_fma(auVar147,auVar151,auVar142);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(ulong *)(local_2a00 + 0x40 + local_2990);
            auVar147 = vpmovzxbd_avx2(auVar7);
            auVar147 = vcvtdq2ps_avx(auVar147);
            auVar100 = vfmadd213ps_fma(auVar147,auVar151,auVar142);
            auVar140._8_8_ = 0;
            auVar140._0_8_ = *(ulong *)(local_2a28 + 0x40 + lVar68);
            auVar150._8_8_ = 0;
            auVar150._0_8_ = *(ulong *)(local_2a28 + 0x48 + lVar68);
            auVar119 = vpminub_avx(auVar140,auVar150);
            auVar131 = vpcmpeqb_avx(auVar140,auVar119);
            auVar147 = vsubps_avx(ZEXT1632(auVar82),local_2880);
            auVar27._4_4_ = fVar161 * auVar147._4_4_;
            auVar27._0_4_ = auVar120._0_4_ * auVar147._0_4_;
            auVar27._8_4_ = fVar88 * auVar147._8_4_;
            auVar27._12_4_ = fVar98 * auVar147._12_4_;
            auVar27._16_4_ = fVar99 * auVar147._16_4_;
            auVar27._20_4_ = fVar107 * auVar147._20_4_;
            auVar27._24_4_ = fVar108 * auVar147._24_4_;
            auVar27._28_4_ = auVar147._28_4_;
            auVar147 = vsubps_avx(ZEXT1632(auVar132),local_28a0);
            auVar28._4_4_ = auVar147._4_4_ * (float)local_2680._4_4_;
            auVar28._0_4_ = auVar147._0_4_ * (float)local_2680._0_4_;
            auVar28._8_4_ = auVar147._8_4_ * fStack_2678;
            auVar28._12_4_ = auVar147._12_4_ * fStack_2674;
            auVar28._16_4_ = auVar147._16_4_ * fStack_2670;
            auVar28._20_4_ = auVar147._20_4_ * fStack_266c;
            auVar28._24_4_ = auVar147._24_4_ * fStack_2668;
            auVar28._28_4_ = auVar147._28_4_;
            auVar147 = vmaxps_avx(auVar27,auVar28);
            auVar102 = vsubps_avx(ZEXT1632(auVar89),local_2880);
            auVar29._4_4_ = auVar102._4_4_ * fStack_25fc;
            auVar29._0_4_ = auVar102._0_4_ * local_2600;
            auVar29._8_4_ = auVar102._8_4_ * fStack_25f8;
            auVar29._12_4_ = auVar102._12_4_ * fStack_25f4;
            auVar29._16_4_ = auVar102._16_4_ * fStack_25f0;
            auVar29._20_4_ = auVar102._20_4_ * fStack_25ec;
            auVar29._24_4_ = auVar102._24_4_ * fStack_25e8;
            auVar29._28_4_ = auVar102._28_4_;
            auVar102 = vsubps_avx(ZEXT1632(auVar111),local_28a0);
            auVar30._4_4_ = auVar102._4_4_ * (float)local_2620._4_4_;
            auVar30._0_4_ = auVar102._0_4_ * (float)local_2620._0_4_;
            auVar30._8_4_ = auVar102._8_4_ * fStack_2618;
            auVar30._12_4_ = auVar102._12_4_ * fStack_2614;
            auVar30._16_4_ = auVar102._16_4_ * fStack_2610;
            auVar30._20_4_ = auVar102._20_4_ * fStack_260c;
            auVar30._24_4_ = auVar102._24_4_ * fStack_2608;
            auVar30._28_4_ = auVar102._28_4_;
            auVar16 = vminps_avx(auVar29,auVar30);
            auVar66._4_4_ = uStack_25bc;
            auVar66._0_4_ = local_25c0;
            auVar66._8_4_ = uStack_25b8;
            auVar66._12_4_ = uStack_25b4;
            auVar66._16_4_ = uStack_25b0;
            auVar66._20_4_ = uStack_25ac;
            auVar66._24_4_ = uStack_25a8;
            auVar66._28_4_ = uStack_25a4;
            auVar102 = vsubps_avx(ZEXT1632(auVar133),auVar66);
            auVar31._4_4_ = auVar102._4_4_ * local_25e0._4_4_;
            auVar31._0_4_ = auVar102._0_4_ * (float)local_25e0;
            auVar31._8_4_ = auVar102._8_4_ * (float)uStack_25d8;
            auVar31._12_4_ = auVar102._12_4_ * uStack_25d8._4_4_;
            auVar31._16_4_ = auVar102._16_4_ * (float)uStack_25d0;
            auVar31._20_4_ = auVar102._20_4_ * uStack_25d0._4_4_;
            auVar31._24_4_ = auVar102._24_4_ * (float)uStack_25c8;
            auVar31._28_4_ = auVar102._28_4_;
            auVar64._4_4_ = uStack_265c;
            auVar64._0_4_ = local_2660;
            auVar64._8_4_ = uStack_2658;
            auVar64._12_4_ = uStack_2654;
            auVar64._16_4_ = uStack_2650;
            auVar64._20_4_ = uStack_264c;
            auVar64._24_4_ = uStack_2648;
            auVar64._28_4_ = uStack_2644;
            auVar102 = vmaxps_avx(auVar31,auVar64);
            local_23c0 = vmaxps_avx(auVar147,auVar102);
            auVar147 = vsubps_avx(ZEXT1632(auVar100),auVar66);
            auVar32._4_4_ = auVar147._4_4_ * (float)local_2640._4_4_;
            auVar32._0_4_ = auVar147._0_4_ * (float)local_2640._0_4_;
            auVar32._8_4_ = auVar147._8_4_ * fStack_2638;
            auVar32._12_4_ = auVar147._12_4_ * fStack_2634;
            auVar32._16_4_ = auVar147._16_4_ * fStack_2630;
            auVar32._20_4_ = auVar147._20_4_ * fStack_262c;
            auVar32._24_4_ = auVar147._24_4_ * fStack_2628;
            auVar32._28_4_ = auVar147._28_4_;
            auVar62._4_4_ = fStack_283c;
            auVar62._0_4_ = local_2840;
            auVar62._8_4_ = fStack_2838;
            auVar62._12_4_ = fStack_2834;
            auVar62._16_4_ = fStack_2830;
            auVar62._20_4_ = fStack_282c;
            auVar62._24_4_ = fStack_2828;
            auVar62._28_4_ = fStack_2824;
            auVar147 = vminps_avx(auVar32,auVar62);
            auVar147 = vminps_avx(auVar16,auVar147);
            auVar147 = vcmpps_avx(local_23c0,auVar147,2);
            auVar119 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
            auVar131 = vpmovzxbw_avx(auVar131);
            auVar119 = vpand_avx(auVar119,auVar131);
            auVar119 = vpshufb_avx(auVar119,_DAT_0205e3c0);
            bVar26 = SUB161(auVar119 >> 7,0) & 1 | (SUB161(auVar119 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar119 >> 0x17,0) & 1) << 2 | (SUB161(auVar119 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar119 >> 0x27,0) & 1) << 4 | (SUB161(auVar119 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar119 >> 0x37,0) & 1) << 6 | SUB161(auVar119 >> 0x3f,0) << 7;
            if (bVar26 != 0) {
              local_2978 = (ulong)bVar26;
              do {
                lVar68 = 0;
                for (uVar77 = local_2978; (uVar77 & 1) == 0;
                    uVar77 = uVar77 >> 1 | 0x8000000000000000) {
                  lVar68 = lVar68 + 1;
                }
                fVar161 = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_23c0 + lVar68 * 4) <= fVar161) {
                  local_27f0 = ZEXT416((uint)fVar161);
                  uVar8 = *(ushort *)(local_2990 + lVar68 * 8);
                  uVar9 = *(ushort *)(local_2990 + 2 + lVar68 * 8);
                  uVar10 = *(uint *)(local_2990 + 0x88);
                  uVar77 = CONCAT44(0,uVar10);
                  uVar72 = *(uint *)(local_2990 + 4 + lVar68 * 8);
                  local_2980 = context->scene;
                  pGVar12 = (local_2980->geometries).items[uVar77].ptr;
                  local_2988 = *(long *)&pGVar12->field_0x58;
                  local_2a10 = (ulong)uVar72;
                  lVar73 = pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar72;
                  local_2a18 = uVar8 & 0x7fff;
                  uVar76 = uVar9 & 0x7fff;
                  uVar11 = *(uint *)(local_2988 + 4 + lVar73);
                  uVar81 = (ulong)uVar11;
                  uVar74 = (ulong)(uVar11 * uVar76 + *(int *)(local_2988 + lVar73) + local_2a18);
                  lVar68 = *(long *)&pGVar12[1].time_range.upper;
                  p_Var13 = pGVar12[1].intersectionFilterN;
                  auVar119 = *(undefined1 (*) [16])(lVar68 + (uVar74 + 1) * (long)p_Var13);
                  auVar131 = *(undefined1 (*) [16])(lVar68 + (uVar74 + uVar81) * (long)p_Var13);
                  lVar80 = uVar74 + uVar81 + 1;
                  auVar82 = *(undefined1 (*) [16])(lVar68 + lVar80 * (long)p_Var13);
                  auVar89 = *(undefined1 (*) [16])
                             (lVar68 + (uVar74 + (-1 < (short)uVar8) + 1) * (long)p_Var13);
                  lVar69 = (ulong)(-1 < (short)uVar8) + lVar80;
                  auVar132 = *(undefined1 (*) [16])(lVar68 + lVar69 * (long)p_Var13);
                  uVar79 = 0;
                  if (-1 < (short)uVar9) {
                    uVar79 = uVar81;
                  }
                  auVar111 = *(undefined1 (*) [16])
                              (lVar68 + (uVar74 + uVar81 + uVar79) * (long)p_Var13);
                  auVar120 = *(undefined1 (*) [16])(lVar68 + (lVar80 + uVar79) * (long)p_Var13);
                  auVar158._16_16_ =
                       *(undefined1 (*) [16])(lVar68 + (uVar79 + lVar69) * (long)p_Var13);
                  auVar158._0_16_ = auVar82;
                  auVar100 = vunpcklps_avx(auVar119,auVar132);
                  auVar133 = vunpckhps_avx(auVar119,auVar132);
                  auVar112 = vunpcklps_avx(auVar89,auVar82);
                  auVar89 = vunpckhps_avx(auVar89,auVar82);
                  auVar83 = vunpcklps_avx(auVar133,auVar89);
                  auVar2 = vunpcklps_avx(auVar100,auVar112);
                  auVar89 = vunpckhps_avx(auVar100,auVar112);
                  auVar100 = vunpcklps_avx(auVar131,auVar120);
                  auVar133 = vunpckhps_avx(auVar131,auVar120);
                  auVar112 = vunpcklps_avx(auVar82,auVar111);
                  auVar111 = vunpckhps_avx(auVar82,auVar111);
                  auVar133 = vunpcklps_avx(auVar133,auVar111);
                  auVar3 = vunpcklps_avx(auVar100,auVar112);
                  auVar111 = vunpckhps_avx(auVar100,auVar112);
                  auVar104._16_16_ = auVar120;
                  auVar104._0_16_ = auVar131;
                  auVar90._16_16_ = auVar132;
                  auVar90._0_16_ = auVar119;
                  auVar147 = vunpcklps_avx(auVar90,auVar104);
                  auVar84._16_16_ = auVar82;
                  auVar84._0_16_ = *(undefined1 (*) [16])(lVar68 + (long)p_Var13 * uVar74);
                  auVar102 = vunpcklps_avx(auVar84,auVar158);
                  auVar125 = vunpcklps_avx(auVar102,auVar147);
                  auVar147 = vunpckhps_avx(auVar102,auVar147);
                  auVar102 = vunpckhps_avx(auVar90,auVar104);
                  auVar16 = vunpckhps_avx(auVar84,auVar158);
                  auVar102 = vunpcklps_avx(auVar16,auVar102);
                  auVar105._16_16_ = auVar2;
                  auVar105._0_16_ = auVar2;
                  auVar122._16_16_ = auVar89;
                  auVar122._0_16_ = auVar89;
                  auVar135._16_16_ = auVar83;
                  auVar135._0_16_ = auVar83;
                  auVar91._16_16_ = auVar3;
                  auVar91._0_16_ = auVar3;
                  auVar169._16_16_ = auVar111;
                  auVar169._0_16_ = auVar111;
                  auVar143._16_16_ = auVar133;
                  auVar143._0_16_ = auVar133;
                  uVar70 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
                  auVar176._4_4_ = uVar70;
                  auVar176._0_4_ = uVar70;
                  auVar176._8_4_ = uVar70;
                  auVar176._12_4_ = uVar70;
                  auVar176._16_4_ = uVar70;
                  auVar176._20_4_ = uVar70;
                  auVar176._24_4_ = uVar70;
                  auVar176._28_4_ = uVar70;
                  uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
                  auVar179._4_4_ = uVar70;
                  auVar179._0_4_ = uVar70;
                  auVar179._8_4_ = uVar70;
                  auVar179._12_4_ = uVar70;
                  auVar179._16_4_ = uVar70;
                  auVar179._20_4_ = uVar70;
                  auVar179._24_4_ = uVar70;
                  auVar179._28_4_ = uVar70;
                  uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                  auVar181._4_4_ = uVar70;
                  auVar181._0_4_ = uVar70;
                  auVar181._8_4_ = uVar70;
                  auVar181._12_4_ = uVar70;
                  auVar181._16_4_ = uVar70;
                  auVar181._20_4_ = uVar70;
                  auVar181._24_4_ = uVar70;
                  auVar181._28_4_ = uVar70;
                  local_23e0 = vsubps_avx(auVar125,auVar176);
                  local_2400 = vsubps_avx(auVar147,auVar179);
                  local_2420 = vsubps_avx(auVar102,auVar181);
                  auVar147 = vsubps_avx(auVar105,auVar176);
                  local_2940 = vsubps_avx(auVar122,auVar179);
                  auVar102 = vsubps_avx(auVar135,auVar181);
                  auVar16 = vsubps_avx(auVar91,auVar176);
                  auVar24 = vsubps_avx(auVar169,auVar179);
                  auVar148 = vsubps_avx(auVar143,auVar181);
                  local_2440 = vsubps_avx(auVar16,local_23e0);
                  local_2480 = vsubps_avx(auVar24,local_2400);
                  local_2460 = vsubps_avx(auVar148,local_2420);
                  auVar85._0_4_ = local_23e0._0_4_ + auVar16._0_4_;
                  auVar85._4_4_ = local_23e0._4_4_ + auVar16._4_4_;
                  auVar85._8_4_ = local_23e0._8_4_ + auVar16._8_4_;
                  auVar85._12_4_ = local_23e0._12_4_ + auVar16._12_4_;
                  auVar85._16_4_ = local_23e0._16_4_ + auVar16._16_4_;
                  auVar85._20_4_ = local_23e0._20_4_ + auVar16._20_4_;
                  auVar85._24_4_ = local_23e0._24_4_ + auVar16._24_4_;
                  auVar85._28_4_ = local_23e0._28_4_ + auVar16._28_4_;
                  auVar114._0_4_ = local_2400._0_4_ + auVar24._0_4_;
                  auVar114._4_4_ = local_2400._4_4_ + auVar24._4_4_;
                  auVar114._8_4_ = local_2400._8_4_ + auVar24._8_4_;
                  auVar114._12_4_ = local_2400._12_4_ + auVar24._12_4_;
                  auVar114._16_4_ = local_2400._16_4_ + auVar24._16_4_;
                  auVar114._20_4_ = local_2400._20_4_ + auVar24._20_4_;
                  auVar114._24_4_ = local_2400._24_4_ + auVar24._24_4_;
                  auVar114._28_4_ = local_2400._28_4_ + auVar24._28_4_;
                  fVar157 = local_2420._0_4_;
                  auVar144._0_4_ = fVar157 + auVar148._0_4_;
                  fVar162 = local_2420._4_4_;
                  auVar144._4_4_ = fVar162 + auVar148._4_4_;
                  fVar163 = local_2420._8_4_;
                  auVar144._8_4_ = fVar163 + auVar148._8_4_;
                  fVar164 = local_2420._12_4_;
                  auVar144._12_4_ = fVar164 + auVar148._12_4_;
                  fVar165 = local_2420._16_4_;
                  auVar144._16_4_ = fVar165 + auVar148._16_4_;
                  fVar166 = local_2420._20_4_;
                  auVar144._20_4_ = fVar166 + auVar148._20_4_;
                  fVar167 = local_2420._24_4_;
                  auVar144._24_4_ = fVar167 + auVar148._24_4_;
                  auVar144._28_4_ = local_2420._28_4_ + auVar148._28_4_;
                  auVar33._4_4_ = local_2460._4_4_ * auVar114._4_4_;
                  auVar33._0_4_ = local_2460._0_4_ * auVar114._0_4_;
                  auVar33._8_4_ = local_2460._8_4_ * auVar114._8_4_;
                  auVar33._12_4_ = local_2460._12_4_ * auVar114._12_4_;
                  auVar33._16_4_ = local_2460._16_4_ * auVar114._16_4_;
                  auVar33._20_4_ = local_2460._20_4_ * auVar114._20_4_;
                  auVar33._24_4_ = local_2460._24_4_ * auVar114._24_4_;
                  auVar33._28_4_ = auVar125._28_4_;
                  auVar131 = vfmsub231ps_fma(auVar33,local_2480,auVar144);
                  auVar34._4_4_ = local_2440._4_4_ * auVar144._4_4_;
                  auVar34._0_4_ = local_2440._0_4_ * auVar144._0_4_;
                  auVar34._8_4_ = local_2440._8_4_ * auVar144._8_4_;
                  auVar34._12_4_ = local_2440._12_4_ * auVar144._12_4_;
                  auVar34._16_4_ = local_2440._16_4_ * auVar144._16_4_;
                  auVar34._20_4_ = local_2440._20_4_ * auVar144._20_4_;
                  auVar34._24_4_ = local_2440._24_4_ * auVar144._24_4_;
                  auVar34._28_4_ = auVar144._28_4_;
                  auVar119 = vfmsub231ps_fma(auVar34,local_2460,auVar85);
                  auVar35._4_4_ = local_2480._4_4_ * auVar85._4_4_;
                  auVar35._0_4_ = local_2480._0_4_ * auVar85._0_4_;
                  auVar35._8_4_ = local_2480._8_4_ * auVar85._8_4_;
                  auVar35._12_4_ = local_2480._12_4_ * auVar85._12_4_;
                  auVar35._16_4_ = local_2480._16_4_ * auVar85._16_4_;
                  auVar35._20_4_ = local_2480._20_4_ * auVar85._20_4_;
                  auVar35._24_4_ = local_2480._24_4_ * auVar85._24_4_;
                  auVar35._28_4_ = auVar85._28_4_;
                  local_2860 = (ray->super_RayK<1>).dir.field_0.m128[2];
                  fStack_285c = local_2860;
                  fStack_2858 = local_2860;
                  fStack_2854 = local_2860;
                  fStack_2850 = local_2860;
                  fStack_284c = local_2860;
                  fStack_2848 = local_2860;
                  fStack_2844 = local_2860;
                  auVar82 = vfmsub231ps_fma(auVar35,local_2440,auVar114);
                  auVar36._4_4_ = local_2860 * auVar82._4_4_;
                  auVar36._0_4_ = local_2860 * auVar82._0_4_;
                  auVar36._8_4_ = local_2860 * auVar82._8_4_;
                  auVar36._12_4_ = local_2860 * auVar82._12_4_;
                  auVar36._16_4_ = local_2860 * 0.0;
                  auVar36._20_4_ = local_2860 * 0.0;
                  auVar36._24_4_ = local_2860 * 0.0;
                  auVar36._28_4_ = local_2480._28_4_;
                  uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
                  local_28c0._4_4_ = uVar70;
                  local_28c0._0_4_ = uVar70;
                  local_28c0._8_4_ = uVar70;
                  local_28c0._12_4_ = uVar70;
                  local_28c0._16_4_ = uVar70;
                  local_28c0._20_4_ = uVar70;
                  local_28c0._24_4_ = uVar70;
                  local_28c0._28_4_ = uVar70;
                  auVar119 = vfmadd231ps_fma(auVar36,local_28c0,ZEXT1632(auVar119));
                  uVar70 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
                  local_2920._4_4_ = uVar70;
                  local_2920._0_4_ = uVar70;
                  local_2920._8_4_ = uVar70;
                  local_2920._12_4_ = uVar70;
                  local_2920._16_4_ = uVar70;
                  local_2920._20_4_ = uVar70;
                  local_2920._24_4_ = uVar70;
                  local_2920._28_4_ = uVar70;
                  auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),local_2920._0_32_,ZEXT1632(auVar131)
                                            );
                  local_24a0 = vsubps_avx(local_2400,local_2940);
                  local_24c0 = vsubps_avx(local_2420,auVar102);
                  auVar145._0_4_ = local_2400._0_4_ + local_2940._0_4_;
                  auVar145._4_4_ = local_2400._4_4_ + local_2940._4_4_;
                  auVar145._8_4_ = local_2400._8_4_ + local_2940._8_4_;
                  auVar145._12_4_ = local_2400._12_4_ + local_2940._12_4_;
                  auVar145._16_4_ = local_2400._16_4_ + local_2940._16_4_;
                  auVar145._20_4_ = local_2400._20_4_ + local_2940._20_4_;
                  auVar145._24_4_ = local_2400._24_4_ + local_2940._24_4_;
                  auVar145._28_4_ = local_2400._28_4_ + local_2940._28_4_;
                  auVar152._0_4_ = fVar157 + auVar102._0_4_;
                  auVar152._4_4_ = fVar162 + auVar102._4_4_;
                  auVar152._8_4_ = fVar163 + auVar102._8_4_;
                  auVar152._12_4_ = fVar164 + auVar102._12_4_;
                  auVar152._16_4_ = fVar165 + auVar102._16_4_;
                  auVar152._20_4_ = fVar166 + auVar102._20_4_;
                  auVar152._24_4_ = fVar167 + auVar102._24_4_;
                  fVar88 = auVar102._28_4_;
                  auVar152._28_4_ = local_2420._28_4_ + fVar88;
                  fVar98 = local_24c0._0_4_;
                  fVar108 = local_24c0._4_4_;
                  auVar37._4_4_ = auVar145._4_4_ * fVar108;
                  auVar37._0_4_ = auVar145._0_4_ * fVar98;
                  fVar110 = local_24c0._8_4_;
                  auVar37._8_4_ = auVar145._8_4_ * fVar110;
                  fVar128 = local_24c0._12_4_;
                  auVar37._12_4_ = auVar145._12_4_ * fVar128;
                  fVar116 = local_24c0._16_4_;
                  auVar37._16_4_ = auVar145._16_4_ * fVar116;
                  fVar18 = local_24c0._20_4_;
                  auVar37._20_4_ = auVar145._20_4_ * fVar18;
                  fVar21 = local_24c0._24_4_;
                  auVar37._24_4_ = auVar145._24_4_ * fVar21;
                  auVar37._28_4_ = fVar88;
                  auVar82 = vfmsub231ps_fma(auVar37,local_24a0,auVar152);
                  local_24e0 = vsubps_avx(local_23e0,auVar147);
                  fVar99 = local_24e0._0_4_;
                  auVar120._0_4_ = local_24e0._4_4_;
                  auVar38._4_4_ = auVar152._4_4_ * auVar120._0_4_;
                  auVar38._0_4_ = auVar152._0_4_ * fVar99;
                  fVar118 = local_24e0._8_4_;
                  auVar38._8_4_ = auVar152._8_4_ * fVar118;
                  fVar129 = local_24e0._12_4_;
                  auVar38._12_4_ = auVar152._12_4_ * fVar129;
                  fVar117 = local_24e0._16_4_;
                  auVar38._16_4_ = auVar152._16_4_ * fVar117;
                  fVar19 = local_24e0._20_4_;
                  auVar38._20_4_ = auVar152._20_4_ * fVar19;
                  fVar22 = local_24e0._24_4_;
                  auVar38._24_4_ = auVar152._24_4_ * fVar22;
                  auVar38._28_4_ = local_2460._28_4_;
                  auVar153._0_4_ = local_23e0._0_4_ + auVar147._0_4_;
                  auVar153._4_4_ = local_23e0._4_4_ + auVar147._4_4_;
                  auVar153._8_4_ = local_23e0._8_4_ + auVar147._8_4_;
                  auVar153._12_4_ = local_23e0._12_4_ + auVar147._12_4_;
                  auVar153._16_4_ = local_23e0._16_4_ + auVar147._16_4_;
                  auVar153._20_4_ = local_23e0._20_4_ + auVar147._20_4_;
                  auVar153._24_4_ = local_23e0._24_4_ + auVar147._24_4_;
                  auVar153._28_4_ = local_23e0._28_4_ + auVar147._28_4_;
                  auVar131 = vfmsub231ps_fma(auVar38,local_24c0,auVar153);
                  fVar107 = local_24a0._0_4_;
                  fVar109 = local_24a0._4_4_;
                  auVar39._4_4_ = auVar153._4_4_ * fVar109;
                  auVar39._0_4_ = auVar153._0_4_ * fVar107;
                  fVar127 = local_24a0._8_4_;
                  auVar39._8_4_ = auVar153._8_4_ * fVar127;
                  fVar115 = local_24a0._12_4_;
                  auVar39._12_4_ = auVar153._12_4_ * fVar115;
                  fVar17 = local_24a0._16_4_;
                  auVar39._16_4_ = auVar153._16_4_ * fVar17;
                  fVar20 = local_24a0._20_4_;
                  auVar39._20_4_ = auVar153._20_4_ * fVar20;
                  fVar23 = local_24a0._24_4_;
                  auVar39._24_4_ = auVar153._24_4_ * fVar23;
                  auVar39._28_4_ = auVar153._28_4_;
                  auVar89 = vfmsub231ps_fma(auVar39,local_24e0,auVar145);
                  auVar154._0_4_ = local_2860 * auVar89._0_4_;
                  auVar154._4_4_ = local_2860 * auVar89._4_4_;
                  auVar154._8_4_ = local_2860 * auVar89._8_4_;
                  auVar154._12_4_ = local_2860 * auVar89._12_4_;
                  auVar154._16_4_ = local_2860 * 0.0;
                  auVar154._20_4_ = local_2860 * 0.0;
                  auVar154._24_4_ = local_2860 * 0.0;
                  auVar154._28_4_ = 0;
                  auVar131 = vfmadd231ps_fma(auVar154,local_28c0,ZEXT1632(auVar131));
                  auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),local_2920._0_32_,ZEXT1632(auVar82))
                  ;
                  auVar125 = vsubps_avx(auVar147,auVar16);
                  auVar136._0_4_ = auVar147._0_4_ + auVar16._0_4_;
                  auVar136._4_4_ = auVar147._4_4_ + auVar16._4_4_;
                  auVar136._8_4_ = auVar147._8_4_ + auVar16._8_4_;
                  auVar136._12_4_ = auVar147._12_4_ + auVar16._12_4_;
                  auVar136._16_4_ = auVar147._16_4_ + auVar16._16_4_;
                  auVar136._20_4_ = auVar147._20_4_ + auVar16._20_4_;
                  auVar136._24_4_ = auVar147._24_4_ + auVar16._24_4_;
                  auVar136._28_4_ = auVar147._28_4_ + auVar16._28_4_;
                  auVar25 = vsubps_avx(local_2940,auVar24);
                  auVar123._0_4_ = local_2940._0_4_ + auVar24._0_4_;
                  auVar123._4_4_ = local_2940._4_4_ + auVar24._4_4_;
                  auVar123._8_4_ = local_2940._8_4_ + auVar24._8_4_;
                  auVar123._12_4_ = local_2940._12_4_ + auVar24._12_4_;
                  auVar123._16_4_ = local_2940._16_4_ + auVar24._16_4_;
                  auVar123._20_4_ = local_2940._20_4_ + auVar24._20_4_;
                  auVar123._24_4_ = local_2940._24_4_ + auVar24._24_4_;
                  auVar123._28_4_ = local_2940._28_4_ + auVar24._28_4_;
                  auVar24 = vsubps_avx(auVar102,auVar148);
                  auVar92._0_4_ = auVar102._0_4_ + auVar148._0_4_;
                  auVar92._4_4_ = auVar102._4_4_ + auVar148._4_4_;
                  auVar92._8_4_ = auVar102._8_4_ + auVar148._8_4_;
                  auVar92._12_4_ = auVar102._12_4_ + auVar148._12_4_;
                  auVar92._16_4_ = auVar102._16_4_ + auVar148._16_4_;
                  auVar92._20_4_ = auVar102._20_4_ + auVar148._20_4_;
                  auVar92._24_4_ = auVar102._24_4_ + auVar148._24_4_;
                  auVar92._28_4_ = fVar88 + auVar148._28_4_;
                  auVar40._4_4_ = auVar24._4_4_ * auVar123._4_4_;
                  auVar40._0_4_ = auVar24._0_4_ * auVar123._0_4_;
                  auVar40._8_4_ = auVar24._8_4_ * auVar123._8_4_;
                  auVar40._12_4_ = auVar24._12_4_ * auVar123._12_4_;
                  auVar40._16_4_ = auVar24._16_4_ * auVar123._16_4_;
                  auVar40._20_4_ = auVar24._20_4_ * auVar123._20_4_;
                  auVar40._24_4_ = auVar24._24_4_ * auVar123._24_4_;
                  auVar40._28_4_ = fVar88;
                  auVar89 = vfmsub231ps_fma(auVar40,auVar25,auVar92);
                  auVar41._4_4_ = auVar92._4_4_ * auVar125._4_4_;
                  auVar41._0_4_ = auVar92._0_4_ * auVar125._0_4_;
                  auVar41._8_4_ = auVar92._8_4_ * auVar125._8_4_;
                  auVar41._12_4_ = auVar92._12_4_ * auVar125._12_4_;
                  auVar41._16_4_ = auVar92._16_4_ * auVar125._16_4_;
                  auVar41._20_4_ = auVar92._20_4_ * auVar125._20_4_;
                  auVar41._24_4_ = auVar92._24_4_ * auVar125._24_4_;
                  auVar41._28_4_ = auVar92._28_4_;
                  auVar82 = vfmsub231ps_fma(auVar41,auVar24,auVar136);
                  auVar42._4_4_ = auVar136._4_4_ * auVar25._4_4_;
                  auVar42._0_4_ = auVar136._0_4_ * auVar25._0_4_;
                  auVar42._8_4_ = auVar136._8_4_ * auVar25._8_4_;
                  auVar42._12_4_ = auVar136._12_4_ * auVar25._12_4_;
                  auVar42._16_4_ = auVar136._16_4_ * auVar25._16_4_;
                  auVar42._20_4_ = auVar136._20_4_ * auVar25._20_4_;
                  auVar42._24_4_ = auVar136._24_4_ * auVar25._24_4_;
                  auVar42._28_4_ = auVar136._28_4_;
                  auVar132 = vfmsub231ps_fma(auVar42,auVar125,auVar123);
                  auVar137._0_4_ = local_2860 * auVar132._0_4_;
                  auVar137._4_4_ = local_2860 * auVar132._4_4_;
                  auVar137._8_4_ = local_2860 * auVar132._8_4_;
                  auVar137._12_4_ = local_2860 * auVar132._12_4_;
                  auVar137._16_4_ = local_2860 * 0.0;
                  auVar137._20_4_ = local_2860 * 0.0;
                  auVar137._24_4_ = local_2860 * 0.0;
                  auVar137._28_4_ = 0;
                  auVar82 = vfmadd231ps_fma(auVar137,local_28c0,ZEXT1632(auVar82));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),local_2920._0_32_,ZEXT1632(auVar89));
                  fVar88 = auVar82._0_4_ + auVar119._0_4_ + auVar131._0_4_;
                  fVar95 = auVar82._4_4_ + auVar119._4_4_ + auVar131._4_4_;
                  fVar96 = auVar82._8_4_ + auVar119._8_4_ + auVar131._8_4_;
                  fVar97 = auVar82._12_4_ + auVar119._12_4_ + auVar131._12_4_;
                  local_27a0 = ZEXT1632(CONCAT412(fVar97,CONCAT48(fVar96,CONCAT44(fVar95,fVar88))));
                  auVar180 = ZEXT1632(auVar119);
                  auVar147 = vminps_avx(auVar180,ZEXT1632(auVar131));
                  auVar147 = vminps_avx(auVar147,ZEXT1632(auVar82));
                  auVar124._8_4_ = 0x7fffffff;
                  auVar124._0_8_ = 0x7fffffff7fffffff;
                  auVar124._12_4_ = 0x7fffffff;
                  auVar124._16_4_ = 0x7fffffff;
                  auVar124._20_4_ = 0x7fffffff;
                  auVar124._24_4_ = 0x7fffffff;
                  auVar124._28_4_ = 0x7fffffff;
                  local_2520 = vandps_avx(local_27a0,auVar124);
                  fVar168 = local_2520._0_4_ * 1.1920929e-07;
                  fVar170 = local_2520._4_4_ * 1.1920929e-07;
                  auVar43._4_4_ = fVar170;
                  auVar43._0_4_ = fVar168;
                  fVar171 = local_2520._8_4_ * 1.1920929e-07;
                  auVar43._8_4_ = fVar171;
                  fVar172 = local_2520._12_4_ * 1.1920929e-07;
                  auVar43._12_4_ = fVar172;
                  fVar173 = local_2520._16_4_ * 1.1920929e-07;
                  auVar43._16_4_ = fVar173;
                  fVar174 = local_2520._20_4_ * 1.1920929e-07;
                  auVar43._20_4_ = fVar174;
                  fVar175 = local_2520._24_4_ * 1.1920929e-07;
                  auVar43._24_4_ = fVar175;
                  auVar43._28_4_ = 0x34000000;
                  auVar177._0_8_ = CONCAT44(fVar170,fVar168) ^ 0x8000000080000000;
                  auVar177._8_4_ = -fVar171;
                  auVar177._12_4_ = -fVar172;
                  auVar177._16_4_ = -fVar173;
                  auVar177._20_4_ = -fVar174;
                  auVar177._24_4_ = -fVar175;
                  auVar177._28_4_ = 0xb4000000;
                  auVar147 = vcmpps_avx(auVar147,auVar177,5);
                  auVar155 = ZEXT1632(auVar131);
                  auVar16 = vmaxps_avx(auVar180,auVar155);
                  auVar102 = vmaxps_avx(auVar16,ZEXT1632(auVar82));
                  auVar102 = vcmpps_avx(auVar102,auVar43,2);
                  local_2940 = vorps_avx(auVar147,auVar102);
                  local_2780 = &local_2a19;
                  auVar148 = local_25a0 & local_2940;
                  if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar148 >> 0x7f,0) != '\0') ||
                        (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar148 >> 0xbf,0) != '\0') ||
                      (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar148[0x1f] < '\0') {
                    auVar44._4_4_ = local_2460._4_4_ * fVar109;
                    auVar44._0_4_ = local_2460._0_4_ * fVar107;
                    auVar44._8_4_ = local_2460._8_4_ * fVar127;
                    auVar44._12_4_ = local_2460._12_4_ * fVar115;
                    auVar44._16_4_ = local_2460._16_4_ * fVar17;
                    auVar44._20_4_ = local_2460._20_4_ * fVar20;
                    auVar44._24_4_ = local_2460._24_4_ * fVar23;
                    auVar44._28_4_ = auVar102._28_4_;
                    auVar45._4_4_ = local_2480._4_4_ * auVar120._0_4_;
                    auVar45._0_4_ = local_2480._0_4_ * fVar99;
                    auVar45._8_4_ = local_2480._8_4_ * fVar118;
                    auVar45._12_4_ = local_2480._12_4_ * fVar129;
                    auVar45._16_4_ = local_2480._16_4_ * fVar117;
                    auVar45._20_4_ = local_2480._20_4_ * fVar19;
                    auVar45._24_4_ = local_2480._24_4_ * fVar22;
                    auVar45._28_4_ = auVar147._28_4_;
                    local_2500 = 0x80000000;
                    uStack_24fc = 0x80000000;
                    uStack_24f8 = 0x80000000;
                    uStack_24f4 = 0x80000000;
                    uStack_24f0 = 0x80000000;
                    uStack_24ec = 0x80000000;
                    uStack_24e8 = 0x80000000;
                    uStack_24e4 = 0x80000000;
                    auVar119 = vfmsub213ps_fma(local_2480,local_24c0,auVar44);
                    auVar46._4_4_ = fVar108 * auVar25._4_4_;
                    auVar46._0_4_ = fVar98 * auVar25._0_4_;
                    auVar46._8_4_ = fVar110 * auVar25._8_4_;
                    auVar46._12_4_ = fVar128 * auVar25._12_4_;
                    auVar46._16_4_ = fVar116 * auVar25._16_4_;
                    auVar46._20_4_ = fVar18 * auVar25._20_4_;
                    auVar46._24_4_ = fVar21 * auVar25._24_4_;
                    auVar46._28_4_ = 0x34000000;
                    auVar47._4_4_ = auVar120._0_4_ * auVar24._4_4_;
                    auVar47._0_4_ = fVar99 * auVar24._0_4_;
                    auVar47._8_4_ = fVar118 * auVar24._8_4_;
                    auVar47._12_4_ = fVar129 * auVar24._12_4_;
                    auVar47._16_4_ = fVar117 * auVar24._16_4_;
                    auVar47._20_4_ = fVar19 * auVar24._20_4_;
                    auVar47._24_4_ = fVar22 * auVar24._24_4_;
                    auVar47._28_4_ = auVar16._28_4_;
                    auVar82 = vfmsub213ps_fma(auVar24,local_24a0,auVar46);
                    auVar147 = vandps_avx(auVar44,auVar124);
                    auVar102 = vandps_avx(auVar46,auVar124);
                    auVar148 = vcmpps_avx(auVar147,auVar102,1);
                    auVar16 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar119),auVar148);
                    auVar48._4_4_ = fVar109 * auVar125._4_4_;
                    auVar48._0_4_ = fVar107 * auVar125._0_4_;
                    auVar48._8_4_ = fVar127 * auVar125._8_4_;
                    auVar48._12_4_ = fVar115 * auVar125._12_4_;
                    auVar48._16_4_ = fVar17 * auVar125._16_4_;
                    auVar48._20_4_ = fVar20 * auVar125._20_4_;
                    auVar48._24_4_ = fVar23 * auVar125._24_4_;
                    auVar48._28_4_ = auVar148._28_4_;
                    auVar119 = vfmsub213ps_fma(auVar125,local_24c0,auVar47);
                    auVar49._4_4_ = local_2440._4_4_ * fVar108;
                    auVar49._0_4_ = local_2440._0_4_ * fVar98;
                    auVar49._8_4_ = local_2440._8_4_ * fVar110;
                    auVar49._12_4_ = local_2440._12_4_ * fVar128;
                    auVar49._16_4_ = local_2440._16_4_ * fVar116;
                    auVar49._20_4_ = local_2440._20_4_ * fVar18;
                    auVar49._24_4_ = local_2440._24_4_ * fVar21;
                    auVar49._28_4_ = local_24c0._28_4_;
                    auVar82 = vfmsub213ps_fma(local_2460,local_24e0,auVar49);
                    auVar147 = vandps_avx(auVar49,auVar124);
                    auVar102 = vandps_avx(auVar47,auVar124);
                    auVar147 = vcmpps_avx(auVar147,auVar102,1);
                    auVar24 = vblendvps_avx(ZEXT1632(auVar119),ZEXT1632(auVar82),auVar147);
                    auVar119 = vfmsub213ps_fma(local_2440,local_24a0,auVar45);
                    auVar82 = vfmsub213ps_fma(auVar25,local_24e0,auVar48);
                    auVar147 = vandps_avx(auVar45,auVar124);
                    auVar102 = vandps_avx(auVar48,auVar124);
                    auVar102 = vcmpps_avx(auVar147,auVar102,1);
                    auVar147 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar119),auVar102);
                    fVar98 = auVar147._0_4_;
                    fVar99 = auVar147._4_4_;
                    auVar50._4_4_ = fVar99 * local_2860;
                    auVar50._0_4_ = fVar98 * local_2860;
                    fVar107 = auVar147._8_4_;
                    auVar50._8_4_ = fVar107 * local_2860;
                    fVar108 = auVar147._12_4_;
                    auVar50._12_4_ = fVar108 * local_2860;
                    auVar120._0_4_ = auVar147._16_4_;
                    auVar50._16_4_ = auVar120._0_4_ * local_2860;
                    fVar109 = auVar147._20_4_;
                    auVar50._20_4_ = fVar109 * local_2860;
                    fVar110 = auVar147._24_4_;
                    auVar50._24_4_ = fVar110 * local_2860;
                    auVar50._28_4_ = auVar102._28_4_;
                    auVar119 = vfmadd213ps_fma(local_28c0,auVar24,auVar50);
                    auVar119 = vfmadd213ps_fma(local_2920._0_32_,auVar16,ZEXT1632(auVar119));
                    fVar118 = auVar119._0_4_ + auVar119._0_4_;
                    fVar127 = auVar119._4_4_ + auVar119._4_4_;
                    fVar128 = auVar119._8_4_ + auVar119._8_4_;
                    fVar129 = auVar119._12_4_ + auVar119._12_4_;
                    auVar125 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar128,CONCAT44(fVar127,fVar118)
                                                                  )));
                    auVar51._4_4_ = fVar99 * fVar162;
                    auVar51._0_4_ = fVar98 * fVar157;
                    auVar51._8_4_ = fVar107 * fVar163;
                    auVar51._12_4_ = fVar108 * fVar164;
                    auVar51._16_4_ = auVar120._0_4_ * fVar165;
                    auVar51._20_4_ = fVar109 * fVar166;
                    auVar51._24_4_ = fVar110 * fVar167;
                    auVar51._28_4_ = auVar148._28_4_;
                    auVar119 = vfmadd213ps_fma(local_2400,auVar24,auVar51);
                    auVar82 = vfmadd213ps_fma(local_23e0,auVar16,ZEXT1632(auVar119));
                    auVar147 = vrcpps_avx(auVar125);
                    auVar178._8_4_ = 0x3f800000;
                    auVar178._0_8_ = &DAT_3f8000003f800000;
                    auVar178._12_4_ = 0x3f800000;
                    auVar178._16_4_ = 0x3f800000;
                    auVar178._20_4_ = 0x3f800000;
                    auVar178._24_4_ = 0x3f800000;
                    auVar178._28_4_ = 0x3f800000;
                    auVar119 = vfnmadd213ps_fma(auVar147,auVar125,auVar178);
                    auVar119 = vfmadd132ps_fma(ZEXT1632(auVar119),auVar147,auVar147);
                    uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
                    auVar146._4_4_ = uVar70;
                    auVar146._0_4_ = uVar70;
                    auVar146._8_4_ = uVar70;
                    auVar146._12_4_ = uVar70;
                    auVar146._16_4_ = uVar70;
                    auVar146._20_4_ = uVar70;
                    auVar146._24_4_ = uVar70;
                    auVar146._28_4_ = uVar70;
                    local_2700 = ZEXT1632(CONCAT412(auVar119._12_4_ *
                                                    (auVar82._12_4_ + auVar82._12_4_),
                                                    CONCAT48(auVar119._8_4_ *
                                                             (auVar82._8_4_ + auVar82._8_4_),
                                                             CONCAT44(auVar119._4_4_ *
                                                                      (auVar82._4_4_ + auVar82._4_4_
                                                                      ),auVar119._0_4_ *
                                                                        (auVar82._0_4_ +
                                                                        auVar82._0_4_)))));
                    auVar147 = vcmpps_avx(auVar146,local_2700,2);
                    auVar159._4_4_ = fVar161;
                    auVar159._0_4_ = fVar161;
                    auVar159._8_4_ = fVar161;
                    auVar159._12_4_ = fVar161;
                    auVar159._16_4_ = fVar161;
                    auVar159._20_4_ = fVar161;
                    auVar159._24_4_ = fVar161;
                    auVar159._28_4_ = fVar161;
                    auVar102 = vcmpps_avx(local_2700,auVar159,2);
                    auVar147 = vandps_avx(auVar102,auVar147);
                    auVar160._0_8_ = CONCAT44(fVar127,fVar118) ^ 0x8000000080000000;
                    auVar160._8_4_ = -fVar128;
                    auVar160._12_4_ = -fVar129;
                    auVar160._16_4_ = 0x80000000;
                    auVar160._20_4_ = 0x80000000;
                    auVar160._24_4_ = 0x80000000;
                    auVar160._28_4_ = 0x80000000;
                    auVar102 = vcmpps_avx(auVar160,auVar125,4);
                    auVar147 = vandps_avx(auVar102,auVar147);
                    auVar102 = vandps_avx(local_2940,local_25a0);
                    auVar147 = vpslld_avx2(auVar147,0x1f);
                    auVar148 = vpsrad_avx2(auVar147,0x1f);
                    auVar147 = auVar102 & auVar148;
                    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar147 >> 0x7f,0) != '\0') ||
                          (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar147 >> 0xbf,0) != '\0') ||
                        (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar147[0x1f] < '\0') {
                      auVar147 = vandps_avx(auVar148,auVar102);
                      local_2780 = &local_2a19;
                      auVar102 = vsubps_avx(local_27a0,auVar155);
                      auVar102 = vblendvps_avx(auVar180,auVar102,local_2540);
                      local_2760 = auVar147;
                      auVar148 = vsubps_avx(local_27a0,auVar180);
                      auVar148 = vblendvps_avx(auVar155,auVar148,local_2540);
                      local_26e0._4_4_ = auVar16._4_4_ * (float)local_2560._4_4_;
                      local_26e0._0_4_ = auVar16._0_4_ * (float)local_2560._0_4_;
                      local_26e0._8_4_ = auVar16._8_4_ * fStack_2558;
                      local_26e0._12_4_ = auVar16._12_4_ * fStack_2554;
                      local_26e0._16_4_ = auVar16._16_4_ * fStack_2550;
                      local_26e0._20_4_ = auVar16._20_4_ * fStack_254c;
                      local_26e0._24_4_ = auVar16._24_4_ * fStack_2548;
                      local_26e0._28_4_ = 0;
                      local_26c0[0] = (float)local_2560._0_4_ * auVar24._0_4_;
                      local_26c0[1] = (float)local_2560._4_4_ * auVar24._4_4_;
                      local_26c0[2] = fStack_2558 * auVar24._8_4_;
                      local_26c0[3] = fStack_2554 * auVar24._12_4_;
                      fStack_26b0 = fStack_2550 * auVar24._16_4_;
                      fStack_26ac = fStack_254c * auVar24._20_4_;
                      fStack_26a8 = fStack_2548 * auVar24._24_4_;
                      uStack_26a4 = auVar24._28_4_;
                      local_26a0[0] = (float)local_2560._0_4_ * fVar98;
                      local_26a0[1] = (float)local_2560._4_4_ * fVar99;
                      local_26a0[2] = fStack_2558 * fVar107;
                      local_26a0[3] = fStack_2554 * fVar108;
                      fStack_2690 = fStack_2550 * auVar120._0_4_;
                      fStack_268c = fStack_254c * fVar109;
                      fStack_2688 = fStack_2548 * fVar110;
                      uStack_2684 = auVar24._28_4_;
                      auVar86._0_8_ = (ulong)CONCAT24(uVar8,(uint)uVar8) & 0x7fff00007fff;
                      auVar86._8_4_ = local_2a18;
                      auVar86._12_4_ = local_2a18;
                      auVar86._16_4_ = local_2a18;
                      auVar86._20_4_ = local_2a18;
                      auVar86._24_4_ = local_2a18;
                      auVar86._28_4_ = local_2a18;
                      auVar16 = vpaddd_avx2(auVar86,_DAT_0205d4c0);
                      auVar106._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                      auVar106._8_4_ = uVar76;
                      auVar106._12_4_ = uVar76;
                      auVar106._16_4_ = uVar76;
                      auVar106._20_4_ = uVar76;
                      auVar106._24_4_ = uVar76;
                      auVar106._28_4_ = uVar76;
                      auVar24 = vpaddd_avx2(auVar106,_DAT_0205d4e0);
                      auVar101._0_4_ = (float)(int)(*(ushort *)(local_2988 + 8 + lVar73) - 1);
                      auVar101._4_12_ = auVar131._4_12_;
                      auVar119 = vrcpss_avx(auVar101,auVar101);
                      auVar82 = vfnmadd213ss_fma(auVar101,auVar119,SUB6416(ZEXT464(0x40000000),0));
                      fVar161 = auVar119._0_4_ * auVar82._0_4_;
                      auVar141._0_4_ = (float)(int)(*(ushort *)(local_2988 + 10 + lVar73) - 1);
                      auVar141._4_12_ = auVar131._4_12_;
                      auVar119 = vrcpss_avx(auVar141,auVar141);
                      auVar131 = vfnmadd213ss_fma(auVar141,auVar119,SUB6416(ZEXT464(0x40000000),0));
                      fVar98 = auVar119._0_4_ * auVar131._0_4_;
                      auVar16 = vcvtdq2ps_avx(auVar16);
                      fVar99 = (fVar88 * auVar16._0_4_ + auVar102._0_4_) * fVar161;
                      fVar107 = (fVar95 * auVar16._4_4_ + auVar102._4_4_) * fVar161;
                      local_27e0._4_4_ = fVar107;
                      local_27e0._0_4_ = fVar99;
                      fVar108 = (fVar96 * auVar16._8_4_ + auVar102._8_4_) * fVar161;
                      local_27e0._8_4_ = fVar108;
                      auVar120._0_4_ = (fVar97 * auVar16._12_4_ + auVar102._12_4_) * fVar161;
                      local_27e0._12_4_ = auVar120._0_4_;
                      fVar109 = (auVar16._16_4_ * 0.0 + auVar102._16_4_) * fVar161;
                      local_27e0._16_4_ = fVar109;
                      fVar110 = (auVar16._20_4_ * 0.0 + auVar102._20_4_) * fVar161;
                      local_27e0._20_4_ = fVar110;
                      fVar118 = (auVar16._24_4_ * 0.0 + auVar102._24_4_) * fVar161;
                      local_27e0._24_4_ = fVar118;
                      local_27e0._28_4_ = fVar161;
                      auVar102 = vcvtdq2ps_avx(auVar24);
                      fVar88 = (fVar88 * auVar102._0_4_ + auVar148._0_4_) * fVar98;
                      fVar127 = (fVar95 * auVar102._4_4_ + auVar148._4_4_) * fVar98;
                      local_27c0._4_4_ = fVar127;
                      local_27c0._0_4_ = fVar88;
                      fVar128 = (fVar96 * auVar102._8_4_ + auVar148._8_4_) * fVar98;
                      local_27c0._8_4_ = fVar128;
                      fVar129 = (fVar97 * auVar102._12_4_ + auVar148._12_4_) * fVar98;
                      local_27c0._12_4_ = fVar129;
                      fVar115 = (auVar102._16_4_ * 0.0 + auVar148._16_4_) * fVar98;
                      local_27c0._16_4_ = fVar115;
                      fVar116 = (auVar102._20_4_ * 0.0 + auVar148._20_4_) * fVar98;
                      local_27c0._20_4_ = fVar116;
                      fVar117 = (auVar102._24_4_ * 0.0 + auVar148._24_4_) * fVar98;
                      local_27c0._24_4_ = fVar117;
                      local_27c0._28_4_ = fVar98;
                      pGVar12 = (local_2980->geometries).items[uVar77].ptr;
                      if ((pGVar12->mask & (ray->super_RayK<1>).mask) != 0) {
                        auVar139 = ZEXT3264(local_2700);
                        local_2820 = auVar147;
                        auVar102 = vrcpps_avx(local_27a0);
                        auVar138._8_4_ = 0x3f800000;
                        auVar138._0_8_ = &DAT_3f8000003f800000;
                        auVar138._12_4_ = 0x3f800000;
                        auVar138._16_4_ = 0x3f800000;
                        auVar138._20_4_ = 0x3f800000;
                        auVar138._24_4_ = 0x3f800000;
                        auVar138._28_4_ = 0x3f800000;
                        auVar119 = vfnmadd213ps_fma(local_27a0,auVar102,auVar138);
                        auVar119 = vfmadd132ps_fma(ZEXT1632(auVar119),auVar102,auVar102);
                        auVar126._8_4_ = 0x219392ef;
                        auVar126._0_8_ = 0x219392ef219392ef;
                        auVar126._12_4_ = 0x219392ef;
                        auVar126._16_4_ = 0x219392ef;
                        auVar126._20_4_ = 0x219392ef;
                        auVar126._24_4_ = 0x219392ef;
                        auVar126._28_4_ = 0x219392ef;
                        auVar102 = vcmpps_avx(local_2520,auVar126,5);
                        auVar102 = vandps_avx(auVar102,ZEXT1632(auVar119));
                        auVar52._4_4_ = fVar107 * auVar102._4_4_;
                        auVar52._0_4_ = fVar99 * auVar102._0_4_;
                        auVar52._8_4_ = fVar108 * auVar102._8_4_;
                        auVar52._12_4_ = auVar120._0_4_ * auVar102._12_4_;
                        auVar52._16_4_ = fVar109 * auVar102._16_4_;
                        auVar52._20_4_ = fVar110 * auVar102._20_4_;
                        auVar52._24_4_ = fVar118 * auVar102._24_4_;
                        auVar52._28_4_ = fVar161;
                        local_2740 = vminps_avx(auVar52,auVar138);
                        auVar53._4_4_ = fVar127 * auVar102._4_4_;
                        auVar53._0_4_ = fVar88 * auVar102._0_4_;
                        auVar53._8_4_ = fVar128 * auVar102._8_4_;
                        auVar53._12_4_ = fVar129 * auVar102._12_4_;
                        auVar53._16_4_ = fVar115 * auVar102._16_4_;
                        auVar53._20_4_ = fVar116 * auVar102._20_4_;
                        auVar53._24_4_ = fVar117 * auVar102._24_4_;
                        auVar53._28_4_ = auVar102._28_4_;
                        local_2720 = vminps_avx(auVar53,auVar138);
                        auVar93._8_4_ = 0x7f800000;
                        auVar93._0_8_ = 0x7f8000007f800000;
                        auVar93._12_4_ = 0x7f800000;
                        auVar93._16_4_ = 0x7f800000;
                        auVar93._20_4_ = 0x7f800000;
                        auVar93._24_4_ = 0x7f800000;
                        auVar93._28_4_ = 0x7f800000;
                        auVar102 = vblendvps_avx(auVar93,local_2700,auVar147);
                        auVar16 = vshufps_avx(auVar102,auVar102,0xb1);
                        auVar16 = vminps_avx(auVar102,auVar16);
                        auVar24 = vshufpd_avx(auVar16,auVar16,5);
                        auVar16 = vminps_avx(auVar16,auVar24);
                        auVar24 = vpermpd_avx2(auVar16,0x4e);
                        auVar16 = vminps_avx(auVar16,auVar24);
                        auVar102 = vcmpps_avx(auVar102,auVar16,0);
                        auVar16 = auVar147 & auVar102;
                        if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar16 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar16 >> 0x7f,0) != '\0') ||
                              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar16 >> 0xbf,0) != '\0') ||
                            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar16[0x1f] < '\0') {
                          auVar147 = vandps_avx(auVar102,auVar147);
                        }
                        uVar76 = vmovmskps_avx(auVar147);
                        uVar11 = 0;
                        for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                          uVar11 = uVar11 + 1;
                        }
                        uVar79 = (ulong)uVar11;
                        pRVar14 = context->args;
                        if ((pRVar14->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar161 = *(float *)(local_2740 + uVar79 * 4);
                          fVar88 = *(float *)(local_2720 + uVar79 * 4);
                          fVar98 = local_26c0[uVar79 - 8];
                          fVar99 = local_26c0[uVar79];
                          fVar107 = local_26a0[uVar79];
                          (ray->super_RayK<1>).tfar = *(float *)(local_2700 + uVar79 * 4);
                          (ray->Ng).field_0.field_0.x = fVar98;
                          (ray->Ng).field_0.field_0.y = fVar99;
                          (ray->Ng).field_0.field_0.z = fVar107;
                          ray->u = fVar161;
                          ray->v = fVar88;
                          ray->primID = uVar72;
                          ray->geomID = uVar10;
                          pRVar15 = context->user;
                          ray->instID[0] = pRVar15->instID[0];
                          ray->instPrimID[0] = pRVar15->instPrimID[0];
                        }
                        else {
                          local_28c0._0_8_ = context->user;
                          local_2920._0_8_ = uVar77;
                          local_2940 = local_2700;
                          do {
                            local_28e4 = *(undefined4 *)(local_2740 + uVar79 * 4);
                            local_28e0 = *(undefined4 *)(local_2720 + uVar79 * 4);
                            local_2860 = (ray->super_RayK<1>).tfar;
                            (ray->super_RayK<1>).tfar = *(float *)(local_2700 + uVar79 * 4);
                            local_28f0 = local_26c0[uVar79 - 8];
                            local_28ec = local_26c0[uVar79];
                            local_28e8 = local_26a0[uVar79];
                            local_28dc = (int)local_2a10;
                            local_28d8 = (int)uVar77;
                            local_28d4 = *(uint *)local_28c0._0_8_;
                            local_28d0 = *(uint *)(local_28c0._0_8_ + 4);
                            local_2a14 = -1;
                            local_2970.valid = &local_2a14;
                            local_2970.geometryUserPtr = pGVar12->userPtr;
                            local_2970.context = (RTCRayQueryContext *)local_28c0._0_8_;
                            local_2970.ray = (RTCRayN *)ray;
                            local_2970.hit = (RTCHitN *)&local_28f0;
                            local_2970.N = 1;
                            if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a7970c:
                              if (pRVar14->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar14->filter)(&local_2970);
                                  auVar139 = ZEXT3264(local_2940);
                                  uVar77 = local_2920._0_8_;
                                }
                                if (*local_2970.valid == 0) goto LAB_01a797a9;
                              }
                              (((Vec3f *)((long)local_2970.ray + 0x30))->field_0).field_0.x =
                                   *(float *)local_2970.hit;
                              (((Vec3f *)((long)local_2970.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_2970.hit + 4);
                              (((Vec3f *)((long)local_2970.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_2970.hit + 8);
                              *(float *)((long)local_2970.ray + 0x3c) =
                                   *(float *)(local_2970.hit + 0xc);
                              *(float *)((long)local_2970.ray + 0x40) =
                                   *(float *)(local_2970.hit + 0x10);
                              *(float *)((long)local_2970.ray + 0x44) =
                                   *(float *)(local_2970.hit + 0x14);
                              *(float *)((long)local_2970.ray + 0x48) =
                                   *(float *)(local_2970.hit + 0x18);
                              *(float *)((long)local_2970.ray + 0x4c) =
                                   *(float *)(local_2970.hit + 0x1c);
                              *(float *)((long)local_2970.ray + 0x50) =
                                   *(float *)(local_2970.hit + 0x20);
                            }
                            else {
                              (*pGVar12->intersectionFilterN)(&local_2970);
                              auVar139 = ZEXT3264(local_2940);
                              uVar77 = local_2920._0_8_;
                              if (*local_2970.valid != 0) goto LAB_01a7970c;
LAB_01a797a9:
                              (ray->super_RayK<1>).tfar = local_2860;
                            }
                            fVar161 = (ray->super_RayK<1>).tfar;
                            auVar87._4_4_ = fVar161;
                            auVar87._0_4_ = fVar161;
                            auVar87._8_4_ = fVar161;
                            auVar87._12_4_ = fVar161;
                            auVar87._16_4_ = fVar161;
                            auVar87._20_4_ = fVar161;
                            auVar87._24_4_ = fVar161;
                            auVar87._28_4_ = fVar161;
                            *(undefined4 *)(local_2820 + uVar79 * 4) = 0;
                            auVar16 = local_2820;
                            auVar102 = vcmpps_avx(auVar139._0_32_,auVar87,2);
                            auVar147 = vandps_avx(auVar102,local_2820);
                            local_2820 = auVar147;
                            auVar16 = auVar16 & auVar102;
                            bVar60 = (auVar16 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar61 = (auVar16 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar59 = (auVar16 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar58 = SUB321(auVar16 >> 0x7f,0) != '\0';
                            bVar57 = (auVar16 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar56 = SUB321(auVar16 >> 0xbf,0) != '\0';
                            bVar55 = (auVar16 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar54 = auVar16[0x1f] < '\0';
                            if (((((((bVar60 || bVar61) || bVar59) || bVar58) || bVar57) || bVar56)
                                || bVar55) || bVar54) {
                              auVar94._8_4_ = 0x7f800000;
                              auVar94._0_8_ = 0x7f8000007f800000;
                              auVar94._12_4_ = 0x7f800000;
                              auVar94._16_4_ = 0x7f800000;
                              auVar94._20_4_ = 0x7f800000;
                              auVar94._24_4_ = 0x7f800000;
                              auVar94._28_4_ = 0x7f800000;
                              auVar102 = vblendvps_avx(auVar94,auVar139._0_32_,auVar147);
                              auVar16 = vshufps_avx(auVar102,auVar102,0xb1);
                              auVar16 = vminps_avx(auVar102,auVar16);
                              auVar24 = vshufpd_avx(auVar16,auVar16,5);
                              auVar16 = vminps_avx(auVar16,auVar24);
                              auVar24 = vpermpd_avx2(auVar16,0x4e);
                              auVar16 = vminps_avx(auVar16,auVar24);
                              auVar102 = vcmpps_avx(auVar102,auVar16,0);
                              auVar16 = auVar147 & auVar102;
                              if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar16 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar16 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar16 >> 0x7f,0) != '\0')
                                    || (auVar16 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar16 >> 0xbf,0) != '\0')
                                  || (auVar16 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar16[0x1f] < '\0') {
                                auVar147 = vandps_avx(auVar102,auVar147);
                              }
                              uVar72 = vmovmskps_avx(auVar147);
                              uVar10 = 0;
                              for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                                uVar10 = uVar10 + 1;
                              }
                              uVar79 = (ulong)uVar10;
                            }
                          } while (((((((bVar60 || bVar61) || bVar59) || bVar58) || bVar57) ||
                                    bVar56) || bVar55) || bVar54);
                        }
                      }
                    }
                  }
                }
                local_2978 = local_2978 - 1 & local_2978;
              } while (local_2978 != 0);
            }
            local_2998 = local_2998 + 1;
            auVar120._0_4_ = local_2580;
            fVar161 = fStack_257c;
            fVar88 = fStack_2578;
            fVar98 = fStack_2574;
            fVar99 = fStack_2570;
            fVar107 = fStack_256c;
            fVar108 = fStack_2568;
          } while (local_2998 != local_29d0);
        }
        local_2840 = (ray->super_RayK<1>).tfar;
        fStack_283c = local_2840;
        fStack_2838 = local_2840;
        fStack_2834 = local_2840;
        fStack_2830 = local_2840;
        fStack_282c = local_2840;
        fStack_2828 = local_2840;
        fStack_2824 = local_2840;
        auVar139 = ZEXT3264(local_2880);
        auVar149 = ZEXT3264(local_28a0);
        auVar156 = ZEXT3264(_local_2680);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }